

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O3

JSAMPARRAY alloc_sarray(j_common_ptr cinfo,int pool_id,JDIMENSION samplesperrow,JDIMENSION numrows)

{
  jpeg_memory_mgr *pjVar1;
  jpeg_error_mgr *pjVar2;
  JSAMPARRAY ppJVar3;
  JSAMPROW pJVar4;
  uint uVar5;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar6;
  
  pjVar1 = cinfo->mem;
  uVar6 = 0xffe8 / (ulong)samplesperrow;
  if (0xffe8 < samplesperrow) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x48;
    (*pjVar2->error_exit)(cinfo);
  }
  if (numrows <= (uint)uVar6) {
    uVar6 = (ulong)numrows;
  }
  *(int *)&pjVar1[1].access_virt_sarray = (int)uVar6;
  ppJVar3 = (JSAMPARRAY)alloc_small(cinfo,pool_id,(ulong)numrows << 3);
  if (numrows != 0) {
    uVar8 = 0;
    do {
      uVar9 = (ulong)(numrows - uVar8);
      if ((uint)uVar6 < numrows - uVar8) {
        uVar9 = uVar6;
      }
      pJVar4 = (JSAMPROW)alloc_large(cinfo,pool_id,uVar9 * samplesperrow);
      uVar5 = (uint)uVar9;
      uVar6 = uVar9;
      while (uVar5 != 0) {
        uVar7 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
        ppJVar3[uVar7] = pJVar4;
        pJVar4 = pJVar4 + samplesperrow;
        uVar5 = (int)uVar6 - 1;
        uVar6 = (ulong)uVar5;
      }
      uVar6 = uVar9;
    } while (uVar8 < numrows);
  }
  return ppJVar3;
}

Assistant:

METHODDEF(JSAMPARRAY)
alloc_sarray (j_common_ptr cinfo, int pool_id,
	      JDIMENSION samplesperrow, JDIMENSION numrows)
/* Allocate a 2-D sample array */
{
  my_mem_ptr mem = (my_mem_ptr) cinfo->mem;
  JSAMPARRAY result;
  JSAMPROW workspace;
  JDIMENSION rowsperchunk, currow, i;
  long ltemp;

  /* Calculate max # of rows allowed in one allocation chunk */
  ltemp = (MAX_ALLOC_CHUNK-SIZEOF(large_pool_hdr)) /
	  ((long) samplesperrow * SIZEOF(JSAMPLE));
  if (ltemp <= 0)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
  if (ltemp < (long) numrows)
    rowsperchunk = (JDIMENSION) ltemp;
  else
    rowsperchunk = numrows;
  mem->last_rowsperchunk = rowsperchunk;

  /* Get space for row pointers (small object) */
  result = (JSAMPARRAY) alloc_small(cinfo, pool_id,
				    (size_t) (numrows * SIZEOF(JSAMPROW)));

  /* Get the rows themselves (large objects) */
  currow = 0;
  while (currow < numrows) {
    rowsperchunk = MIN(rowsperchunk, numrows - currow);
    workspace = (JSAMPROW) alloc_large(cinfo, pool_id,
	(size_t) ((size_t) rowsperchunk * (size_t) samplesperrow
		  * SIZEOF(JSAMPLE)));
    for (i = rowsperchunk; i > 0; i--) {
      result[currow++] = workspace;
      workspace += samplesperrow;
    }
  }

  return result;
}